

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

Vec_Str_t * Scl_LibertyParseGenlibStr(char *pFileName,int fVerbose)

{
  Scl_Tree_t *p_00;
  Vec_Str_t *vStr;
  Scl_Tree_t *p;
  int fVerbose_local;
  char *pFileName_local;
  
  p_00 = Scl_LibertyParse(pFileName,fVerbose);
  if (p_00 == (Scl_Tree_t *)0x0) {
    pFileName_local = (char *)0x0;
  }
  else {
    pFileName_local = (char *)Scl_LibertyReadGenlibStr(p_00,fVerbose);
    Scl_LibertyStop(p_00,fVerbose);
  }
  return (Vec_Str_t *)pFileName_local;
}

Assistant:

Vec_Str_t * Scl_LibertyParseGenlibStr( char * pFileName, int fVerbose )
{
    Scl_Tree_t * p;
    Vec_Str_t * vStr;
    p = Scl_LibertyParse( pFileName, fVerbose );
    if ( p == NULL )
        return NULL;
//    Scl_LibertyRead( p, "temp_.lib" );
    vStr = Scl_LibertyReadGenlibStr( p, fVerbose );
    Scl_LibertyStop( p, fVerbose );
//    Scl_LibertyStringDump( "test_genlib.lib", vStr );
    return vStr;
}